

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd_int8.h
# Opt level: O0

void ncnn::conv3x3s1_winograd23_transform_kernel_tile_int8
               (Mat *kernel,Mat *A,int inch,int i,int max_ii,int k,int max_kk)

{
  char cVar1;
  char cVar2;
  char cVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short z3;
  short z2;
  short z1;
  short z0;
  short r2_1;
  short r1_1;
  short r0_1;
  int m_1;
  char r2;
  char r1;
  char r0;
  char *pcStack_60;
  int m;
  char *k0;
  short tmp [4] [3];
  int kk;
  int ii;
  short *ptmp;
  int k_local;
  int max_ii_local;
  int i_local;
  int inch_local;
  Mat *A_local;
  Mat *kernel_local;
  
  _kk = (short *)A->data;
  tmp[3][1] = 0;
  tmp[3][2] = 0;
  for (; (int)tmp[3]._2_4_ < max_ii; tmp[3]._2_4_ = tmp[3]._2_4_ + 1) {
    tmp[2][2] = 0;
    tmp[3][0] = 0;
    for (; (int)tmp._16_4_ < max_kk; tmp._16_4_ = tmp._16_4_ + 1) {
      pcStack_60 = (char *)((long)kernel->data +
                           (long)((k + tmp._16_4_) * 9) + (long)((i + tmp[3]._2_4_) * inch * 9));
      for (m_1 = 0; m_1 < 3; m_1 = m_1 + 1) {
        cVar1 = *pcStack_60;
        cVar2 = pcStack_60[1];
        cVar3 = pcStack_60[2];
        tmp[-2][(long)m_1 + 2] = (short)cVar1 << 1;
        tmp[-1][(long)m_1 + 2] = (short)cVar1 + (short)cVar2 + (short)cVar3;
        tmp[0][(long)m_1 + 2] = ((short)cVar1 - (short)cVar2) + (short)cVar3;
        tmp[1][(long)m_1 + 2] = (short)cVar3 << 1;
        pcStack_60 = pcStack_60 + 3;
      }
      for (_z0 = 0; _z0 < 4; _z0 = _z0 + 1) {
        sVar4 = tmp[(long)_z0 + -2][2];
        sVar5 = tmp[(long)_z0 + -1][0];
        sVar6 = tmp[(long)_z0 + -1][1];
        *_kk = sVar4 << 1;
        _kk[1] = sVar4 + sVar5 + sVar6;
        _kk[2] = (sVar4 - sVar5) + sVar6;
        _kk[3] = sVar6 << 1;
        _kk = _kk + 4;
      }
    }
  }
  return;
}

Assistant:

static inline void conv3x3s1_winograd23_transform_kernel_tile_int8(const Mat& kernel, Mat& A, int inch, int i, int max_ii, int k, int max_kk)
{
    // const signed char ktm[4][3] = {
    //     {2, 0, 0},
    //     {1, 1, 1},
    //     {1, -1, 1},
    //     {0, 0, 2}
    // };

    short* ptmp = A;

    int ii = 0;
    for (; ii < max_ii; ii++)
    {
        int kk = 0;
        for (; kk < max_kk; kk++)
        {
            short tmp[4][3];

            const signed char* k0 = (const signed char*)kernel + (i + ii) * inch * 9 + (k + kk) * 9;

            for (int m = 0; m < 3; m++)
            {
                signed char r0 = k0[0];
                signed char r1 = k0[1];
                signed char r2 = k0[2];

                tmp[0][m] = r0 * 2;
                tmp[1][m] = r0 + r1 + r2;
                tmp[2][m] = r0 - r1 + r2;
                tmp[3][m] = r2 * 2;

                k0 += 3;
            }

            for (int m = 0; m < 4; m++)
            {
                short r0 = tmp[m][0];
                short r1 = tmp[m][1];
                short r2 = tmp[m][2];

                short z0 = r0 * 2;
                short z1 = r0 + r1 + r2;
                short z2 = r0 - r1 + r2;
                short z3 = r2 * 2;

                ptmp[0] = z0;
                ptmp[1] = z1;
                ptmp[2] = z2;
                ptmp[3] = z3;
                ptmp += 4;
            }
        }
    }
}